

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_elf32ppcbe.c
# Opt level: O0

void amiga_setlnksym(GlobalVars *gv,Symbol *xdef)

{
  undefined4 uVar1;
  Section *pSVar2;
  LinkedSection *pLVar3;
  GlobalVars *in_RSI;
  GlobalVars *in_RDI;
  GlobalVars *unaff_retaddr;
  uint8_t in_stack_0000000c;
  uint8_t in_stack_0000000d;
  uint8_t in_stack_0000000e;
  uint8_t in_stack_0000000f;
  LinkedSection *ls;
  Symbol *in_stack_ffffffffffffffe8;
  
  if ((((ulong)(in_RSI->flavours).flavour_dir & 0x100) == 0) ||
     (((ulong)in_RSI->dest_name & 0x80000000) == 0)) {
    elf_setlnksym(in_RSI,in_stack_ffffffffffffffe8);
  }
  else {
    switch(*(uint *)&in_RSI->dest_name & 0x7fffffff) {
    case 0:
    case 1:
      pLVar3 = smalldata_section(in_RDI);
      (in_RSI->flavours).flavours = (char **)(pLVar3->sections).first;
      break;
    case 2:
      pLVar3 = find_lnksec((GlobalVars *)xdef,(char *)ls,in_stack_0000000f,in_stack_0000000e,
                           in_stack_0000000d,in_stack_0000000c);
      if (pLVar3 != (LinkedSection *)0x0) {
        uVar1 = *(undefined4 *)((long)&pLVar3->size + 4);
        (in_RSI->flavours).n_flavours = *(undefined4 *)&pLVar3->size;
        (in_RSI->flavours).flavours_len = uVar1;
      }
      break;
    case 3:
      pLVar3 = find_lnksec((GlobalVars *)xdef,(char *)ls,in_stack_0000000f,in_stack_0000000e,
                           in_stack_0000000d,in_stack_0000000c);
      if (pLVar3 != (LinkedSection *)0x0) {
        uVar1 = *(undefined4 *)((long)&pLVar3->size + 4);
        (in_RSI->flavours).n_flavours = *(undefined4 *)&pLVar3->size;
        (in_RSI->flavours).flavours_len = uVar1;
      }
      break;
    case 4:
      find_lnksec((GlobalVars *)xdef,(char *)ls,in_stack_0000000f,in_stack_0000000e,
                  in_stack_0000000d,in_stack_0000000c);
      pSVar2 = ddrelocs_sec(unaff_retaddr,(LinkedSection *)in_RDI);
      (in_RSI->flavours).flavours = (char **)pSVar2;
      break;
    case 5:
      pLVar3 = find_lnksec((GlobalVars *)xdef,(char *)ls,in_stack_0000000f,in_stack_0000000e,
                           in_stack_0000000d,in_stack_0000000c);
      if (pLVar3 != (LinkedSection *)0x0) {
        uVar1 = *(undefined4 *)((long)&pLVar3->size + 4);
        (in_RSI->flavours).n_flavours = *(undefined4 *)&pLVar3->size;
        (in_RSI->flavours).flavours_len = uVar1;
      }
    }
    *(byte *)((long)&(in_RSI->flavours).flavour_dir + 1) =
         *(byte *)((long)&(in_RSI->flavours).flavour_dir + 1) & 0xfe;
  }
  return;
}

Assistant:

static void amiga_setlnksym(struct GlobalVars *gv,struct Symbol *xdef)
{
  if ((xdef->flags & SYMF_LNKSYM) && (xdef->extra & SYMX_SPECIAL)) {
    struct LinkedSection *ls;

    switch (xdef->extra & ~SYMX_SPECIAL) {
      case LINKERDB:
      case R13INIT:
        ls = smalldata_section(gv);
        xdef->relsect = (struct Section *)ls->sections.first;
        break;
      case SDATASIZE:
        if (ls = find_lnksec(gv,sdata_name,0,0,0,0))
          xdef->value = (lword)ls->size;
        break;
      case SBSSSIZE:
        if (ls = find_lnksec(gv,sbss_name,0,0,0,0))
          xdef->value = (lword)ls->size;
        break;
      case DDRELOCS:
        xdef->relsect = ddrelocs_sec(gv,find_lnksec(gv,sdata_name,0,0,0,0));
        break;
      case TEXTSIZE:
        if (ls = find_lnksec(gv,text_name,0,0,0,0))
          xdef->value = (lword)ls->size;
        break;
    }
    xdef->flags &= ~SYMF_LNKSYM;  /* do not init again */
  }
  else
    elf_setlnksym(gv,xdef);
}